

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::
operator()(arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *this,
          handle handle)

{
  size_t *psVar1;
  parse_context *ppVar2;
  char *pcVar3;
  long lVar4;
  
  ppVar2 = this->parse_ctx_;
  if (this->ptr_ != (char *)0x0) {
    pcVar3 = (ppVar2->format_str_).data_;
    lVar4 = (long)this->ptr_ - (long)pcVar3;
    if (lVar4 < 0) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O3/_deps/fmt-src/include/fmt/core.h"
                  ,0x13d,"negative value");
    }
    (ppVar2->format_str_).data_ = pcVar3 + lVar4;
    psVar1 = &(ppVar2->format_str_).size_;
    *psVar1 = *psVar1 - lVar4;
  }
  (*handle.custom_.format)(handle.custom_.value,ppVar2,this->ctx_);
  return (iterator)(this->ctx_->out_).container;
}

Assistant:

iterator operator()(typename basic_format_arg<context_type>::handle handle) {
    if (ptr_) advance_to(*parse_ctx_, ptr_);
    handle.format(*parse_ctx_, ctx_);
    return ctx_.out();
  }